

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

result_type __thiscall
Catch::uniform_integer_distribution<unsigned_long>::operator()
          (uniform_integer_distribution<unsigned_long> *this,SimplePcg32 *g)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  uint64_t uVar12;
  
  uVar10 = this->m_ab_distance;
  uVar12 = g->m_state;
  if (uVar10 == 0) {
    uVar10 = 0;
    bVar11 = true;
    do {
      bVar8 = bVar11;
      uVar5 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
      bVar7 = (byte)(uVar12 >> 0x3b);
      uVar12 = uVar12 * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
      uVar10 = (ulong)(uVar5 >> bVar7 | uVar5 << 0x20 - bVar7) | uVar10 << 0x20;
      bVar11 = false;
    } while (bVar8);
    g->m_state = uVar12;
    return uVar10;
  }
  uVar6 = 0;
  bVar11 = true;
  do {
    bVar8 = bVar11;
    uVar5 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
    bVar7 = (byte)(uVar12 >> 0x3b);
    uVar12 = uVar12 * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
    uVar6 = (ulong)(uVar5 >> bVar7 | uVar5 << 0x20 - bVar7) | uVar6 << 0x20;
    bVar11 = false;
  } while (bVar8);
  g->m_state = uVar12;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar10;
  lVar9 = SUB168(auVar1 * auVar3,8);
  if (SUB168(auVar1 * auVar3,0) < this->m_rejection_threshold) {
    bVar11 = true;
    uVar6 = 0;
    do {
      uVar5 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
      bVar7 = (byte)(uVar12 >> 0x3b);
      uVar12 = uVar12 * 0x5851f42d4c957f2d + 0x27da198a7f2728ed;
      uVar6 = (ulong)(uVar5 >> bVar7 | uVar5 << 0x20 - bVar7) | uVar6 << 0x20;
      if (!bVar11) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar6;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar10;
        lVar9 = SUB168(auVar2 * auVar4,8);
        if (this->m_rejection_threshold <= SUB168(auVar2 * auVar4,0)) goto LAB_001670ce;
        uVar6 = 0;
      }
      bVar11 = (bool)(bVar11 ^ 1);
    } while( true );
  }
LAB_001670d1:
  return lVar9 + this->m_a;
LAB_001670ce:
  g->m_state = uVar12;
  goto LAB_001670d1;
}

Assistant:

result_type operator()( Generator& g ) {
        // All possible values of result_type are valid.
        if ( m_ab_distance == 0 ) {
            return transposeBack( Detail::fillBitsFrom<UnsignedIntegerType>( g ) );
        }

        auto random_number = Detail::fillBitsFrom<UnsignedIntegerType>( g );
        auto emul = Detail::extendedMult( random_number, m_ab_distance );
        // Unlike Lemire's algorithm we skip the ab_distance check, since
        // we precomputed the rejection threshold, which is always tighter.
        while (emul.lower < m_rejection_threshold) {
            random_number = Detail::fillBitsFrom<UnsignedIntegerType>( g );
            emul = Detail::extendedMult( random_number, m_ab_distance );
        }

        return transposeBack(m_a + emul.upper);
    }